

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O0

Option<const_Kernel::TermList_&> __thiscall
Lib::Map<Kernel::PolyNf,_Kernel::TermList,_Lib::DefaultHash>::tryGet
          (Map<Kernel::PolyNf,_Kernel::TermList,_Lib::DefaultHash> *this,PolyNf *key)

{
  bool bVar1;
  uint code_00;
  Map<Kernel::PolyNf,_Kernel::TermList,_Lib::DefaultHash> *in_RSI;
  OptionBase<const_Kernel::TermList_&> in_RDI;
  Entry *entry;
  uint code;
  PolyNf *in_stack_ffffffffffffffb8;
  OptionBaseRef<const_Kernel::TermList_*> o1;
  Entry *local_28;
  
  o1._elem = (TermList *)in_RDI.super_OptionBaseRef<const_Kernel::TermList_*>._elem;
  code_00 = hashCode((Map<Kernel::PolyNf,_Kernel::TermList,_Lib::DefaultHash> *)
                     in_RDI.super_OptionBaseRef<const_Kernel::TermList_*>._elem,
                     in_stack_ffffffffffffffb8);
  local_28 = firstEntryForCode(in_RSI,code_00);
  do {
    bVar1 = Entry::occupied(local_28);
    if (!bVar1) {
      memset(o1._elem,0,8);
      Option<const_Kernel::TermList_&>::Option((Option<const_Kernel::TermList_&> *)0x92b251);
      return (Option<const_Kernel::TermList_&>)
             (TermList *)in_RDI.super_OptionBaseRef<const_Kernel::TermList_*>._elem;
    }
    if (local_28->code == code_00) {
      Entry::key(local_28);
      bVar1 = DefaultHash::equals<Kernel::PolyNf>((PolyNf *)o1._elem,in_stack_ffffffffffffffb8);
      if (bVar1) {
        Entry::value(local_28);
        Option<const_Kernel::TermList_&>::OptionBase
                  ((Option<const_Kernel::TermList_&> *)o1._elem,
                   (TermList *)in_stack_ffffffffffffffb8);
        return (Option<const_Kernel::TermList_&>)
               (TermList *)in_RDI.super_OptionBaseRef<const_Kernel::TermList_*>._elem;
      }
    }
    local_28 = nextEntry(in_RSI,local_28);
  } while( true );
}

Assistant:

Option<Val const&> tryGet(Key const& key) const
  {
    using Opt = Option<Val const&>;

    auto code = hashCode(key);
    Entry* entry;
    for (entry = firstEntryForCode(code); entry->occupied(); entry = nextEntry(entry)) {
      if (entry->code == code && Hash::equals(entry->key(),key)) {
        return Opt(entry->value());
      }
    }

    return Opt();
  }